

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttocsv.cpp
# Opt level: O0

void footprinttocsv::printrowsz(int event_id,FILE *finx,longlong size,longlong uncompressed_length)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  uint *local_88;
  EventRow *row;
  pointer puStack_78;
  int ret;
  uLongf dest_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed_buf;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed_buf;
  uLongf i;
  longlong uncompressed_length_local;
  longlong size_local;
  FILE *finx_local;
  int event_id_local;
  
  compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,size + 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dest_length);
  if (uncompressed_length < 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dest_length,size * 0x14);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dest_length,
               uncompressed_length);
  }
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  fread(pvVar2,size,1,(FILE *)finx);
  puStack_78 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &dest_length);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dest_length,0);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  uVar1 = uncompress(pvVar2,&stack0xffffffffffffff88,pvVar3,size);
  if (uVar1 != 0) {
    fprintf(_stderr,"FATAL: Got bad return code from uncompress %d\n",(ulong)uVar1);
    exit(-1);
  }
  local_88 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &dest_length,0);
  for (; compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage < puStack_78;
      compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 0xc) {
    printf("%d, %u, %d, %.10e\n",(double)(float)local_88[2],(ulong)(uint)event_id,(ulong)*local_88,
           (ulong)local_88[1]);
    local_88 = local_88 + 3;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dest_length);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void printrowsz(int event_id, FILE *finx, long long size,
			long long uncompressed_length)
	{
		uLongf i = 0;
		std::vector<unsigned char > compressed_buf;
		compressed_buf.resize(size + 1);

		std::vector<unsigned char > uncompressed_buf;
		if (uncompressed_length > 0) {
			uncompressed_buf.resize(uncompressed_length);
		} else {
			uncompressed_buf.resize(size * 20);
		}
		fread(&compressed_buf[0], size, 1, finx);
		uLongf dest_length = (uLongf)uncompressed_buf.size();
		int ret = uncompress(&uncompressed_buf[0], &dest_length, &compressed_buf[0], size);
		if (ret != Z_OK) {
			fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
			exit(-1);
		}

		EventRow *row = (EventRow *)&uncompressed_buf[0];
		while (i < dest_length) {
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
			printf("%d, %llu, %d, %.10e\n", event_id, row->areaperil_id, row->intensity_bin_id, row->probability);
#else
			printf("%d, %u, %d, %.10e\n", event_id, row->areaperil_id, row->intensity_bin_id, row->probability);
#endif
			row++;
			i += sizeof(EventRow);
		}
	}